

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_next.cpp
# Opt level: O0

unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_> __thiscall
pfederc::Lexer::nextTokenNum(Lexer *this)

{
  int iVar1;
  Lexer *in_RSI;
  Position local_58;
  Position local_40;
  Position local_28;
  Lexer *this_local;
  
  this_local = this;
  if (in_RSI->currentChar == 0x30) {
    nextChar(in_RSI);
    iVar1 = in_RSI->currentChar;
    if (iVar1 == 0x62) {
      nextTokenBinNum(this);
    }
    else if (iVar1 == 0x6f) {
      nextTokenOctNum(this);
    }
    else if (iVar1 == 0x78) {
      nextTokenHexNum(this);
    }
    else {
      iVar1 = isdigit(in_RSI->currentChar);
      if (iVar1 == 0) {
        if (in_RSI->currentChar == 0x2e) {
          nextTokenFltNum(this,(size_t)in_RSI);
        }
        else {
          nextTokenNumType(this,(uint64_t)in_RSI);
        }
      }
      else {
        local_28.line._6_2_ = 2;
        local_28.line._0_4_ = 7;
        getCurrentCursor(&local_58,in_RSI);
        Position::Position(&local_40,local_58.line,in_RSI->currentStartIndex,
                           in_RSI->currentStartIndex);
        std::
        make_unique<pfederc::Error<pfederc::LexerErrorCode>,pfederc::Level,pfederc::LexerErrorCode,pfederc::Position>
                  ((Level *)&local_28.startIndex,(LexerErrorCode *)((long)&local_28.line + 6),
                   &local_28);
        generateError(this,(unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
                            *)in_RSI);
        std::
        unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
        ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
                       *)&local_28.startIndex);
      }
    }
  }
  else {
    nextTokenDecNum(this);
  }
  return (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
         (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Token> Lexer::nextTokenNum() noexcept {
  if (currentChar == '0') {
    nextChar(); // eat 0
    switch (currentChar) {
    case 'b':
      return nextTokenBinNum();
    case 'o':
      return nextTokenOctNum();
    case 'x':
      return nextTokenHexNum();
    default:
      if (isdigit(currentChar)) {
        return generateError(std::make_unique<LexerError>(LVL_ERROR,
          LexerErrorCode::LEX_ERR_NUM_LEADING_ZERO, Position{getCurrentCursor().line,
            currentStartIndex, currentStartIndex}));
      } else if (currentChar == '.') {
        return nextTokenFltNum(0);
      }

      return nextTokenNumType(0);
    }
  }

  return nextTokenDecNum();
}